

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O2

void i2cp_begin(i2cp_state *state)

{
  uint8_t b;
  i2cp_stringbuf str;
  
  if (state->sentinit == false) {
    b = '*';
    (*state->write)(state->writeimpl,&b,1);
    i2cp_putstring(&str,"0.9.32");
    (str.data + (ulong)str.data[0] + 1)[0] = '\0';
    (str.data + (ulong)str.data[0] + 1)[1] = '\0';
    i2cp_ringbuf_append(&state->writebuf,' ',str.data,str.data[0] + 3);
    i2cp_flush_write(state);
    state->sentinit = true;
  }
  return;
}

Assistant:

void i2cp_begin(struct i2cp_state * state)
{
  if(!state->sentinit)
  {
    // protocol byte
    uint8_t b = 0x2a;
    i2cp_write_msg(&b, 1, state);

    // get date messagee
    struct i2cp_stringbuf str;
    i2cp_putstring(&str, I2CP_VERSION);
    uint32_t sz = i2cp_buflen(&str);
    // empty mapping
    htobe16buf(str.data + sz, 0);
    sz += 2;
    i2cp_queue_send(state, GETDATE, str.data, sz);
    i2cp_flush_write(state);
    state->sentinit = true;
  }
}